

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

FixedFieldInfo * __thiscall
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(ObjTypeSpecFldInfo *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  intptr_t iVar5;
  
  uVar3._0_2_ = (this->m_data).flags;
  uVar3._2_2_ = (this->m_data).slotIndex;
  if ((uVar3 >> 8 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x150,"(HasFixedValue())","HasFixedValue()");
    if (!bVar2) goto LAB_005a10a0;
    *puVar4 = 0;
    uVar3 = (uint)(this->m_data).flags;
  }
  if ((uVar3 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x151,"(IsPoly())","IsPoly()");
    if (!bVar2) goto LAB_005a10a0;
    *puVar4 = 0;
  }
  if ((this->m_data).fixedFieldCount != 0) {
    if ((this->m_data).fixedFieldInfoArraySize <= i) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x154,"(i < m_data.fixedFieldInfoArraySize)",
                         "i < m_data.fixedFieldInfoArraySize");
      if (!bVar2) {
LAB_005a10a0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    iVar5 = FixedFieldInfo::GetFuncInfoAddr
                      ((FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i));
    if (iVar5 != 0) {
      return (FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i);
    }
  }
  return (FixedFieldInfo *)0x0;
}

Assistant:

FixedFieldInfo *
ObjTypeSpecFldInfo::GetFixedFieldIfAvailableAsFixedFunction(uint i)
{
    Assert(HasFixedValue());
    Assert(IsPoly());
    if (m_data.fixedFieldCount > 0)
    {
        AssertOrFailFast(i < m_data.fixedFieldInfoArraySize);
        if (GetFixedFieldInfoArray()[i].GetFuncInfoAddr() != 0)
        {
            return &GetFixedFieldInfoArray()[i];
        }
    }
    return nullptr;
}